

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O0

int adios2::utils::printAttributeValue<double>(Engine *fp,IO *io,Attribute<double> *attribute)

{
  size_type sVar1;
  long in_RDX;
  size_t j;
  size_t nelems;
  DataType adiosvartype;
  bool in_stack_000000fe;
  bool in_stack_000000ff;
  DataType in_stack_00000100;
  int in_stack_00000104;
  void *in_stack_00000108;
  size_type local_30;
  
  if ((*(byte *)(in_RDX + 0x38) & 1) == 0) {
    fprintf(outf,"{");
    sVar1 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RDX + 0x40));
    for (local_30 = 0; local_30 < sVar1; local_30 = local_30 + 1) {
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(in_RDX + 0x40),local_30);
      print_data(in_stack_00000108,in_stack_00000104,in_stack_00000100,in_stack_000000ff,
                 in_stack_000000fe);
      if (local_30 < sVar1 - 1) {
        fprintf(outf,", ");
      }
    }
    fprintf(outf,"}");
  }
  else {
    print_data(in_stack_00000108,in_stack_00000104,in_stack_00000100,in_stack_000000ff,
               in_stack_000000fe);
  }
  return 0;
}

Assistant:

int printAttributeValue(core::Engine *fp, core::IO *io, core::Attribute<T> *attribute)
{
    DataType adiosvartype = attribute->m_Type;
    if (attribute->m_IsSingleValue)
    {
        print_data((void *)&attribute->m_DataSingleValue, 0, adiosvartype, true);
    }
    else
    {
        fprintf(outf, "{");
        size_t nelems = attribute->m_DataArray.size();
        for (size_t j = 0; j < nelems; j++)
        {
            print_data((void *)&attribute->m_DataArray[j], 0, adiosvartype, true);
            if (j < nelems - 1)
            {
                fprintf(outf, ", ");
            }
        }
        fprintf(outf, "}");
    }
    return 0;
}